

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_parseResetIllegalChild_Test::~Parser_parseResetIllegalChild_Test
          (Parser_parseResetIllegalChild_Test *this)

{
  Parser_parseResetIllegalChild_Test *this_local;
  
  ~Parser_parseResetIllegalChild_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, parseResetIllegalChild)
{
    const std::string e = "Reset in component 'componentA' has an invalid child 'initial_value'.";
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\" id=\"mid\">\n"
        "  <component name=\"componentA\" id=\"c2id\">\n"
        "    <variable name=\"variable1\" units=\"\" id=\"vid\"/>\n"
        "    <variable name=\"variable2\" units=\"\" id=\"vid2\"/>\n"
        "    <reset order=\"1\" id=\"rid\" variable=\"variable1\" test_variable=\"variable2\">\n"
        "      <test_value>\n"
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply />\n"
        "        </math>\n"
        "      </test_value>\n"
        "      <reset_value>\n"
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply />\n"
        "        </math>\n"
        "      </reset_value>\n"
        "      <initial_value>\n"
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply />\n"
        "        </math>\n"
        "      </initial_value>\n"
        "    </reset>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ParserPtr p = libcellml::Parser::create();
    libcellml::ModelPtr model = p->parseModel(in);

    EXPECT_EQ(size_t(1), p->errorCount());
    EXPECT_EQ(e, p->error(0)->description());

    libcellml::ComponentPtr c = model->component(0);
    EXPECT_EQ(size_t(1), c->resetCount());

    libcellml::ResetPtr r = c->reset(0);
    EXPECT_EQ(1, r->order());

    libcellml::VariablePtr v1 = r->variable();
    EXPECT_EQ("variable1", v1->name());

    libcellml::VariablePtr v2 = r->testVariable();
    EXPECT_EQ("variable2", v2->name());

    std::string testValueString = r->testValue();
    const std::string t =
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply/>\n"
        "        </math>\n";
    EXPECT_EQ(t, testValueString);

    std::string resetValueString = r->resetValue();
    const std::string rt =
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply/>\n"
        "        </math>\n";
    EXPECT_EQ(rt, resetValueString);
}